

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadalloc.h
# Opt level: O2

void snmalloc::CheckInitPthread::register_clean_up(void)

{
  uint *puVar1;
  
  puVar1 = Singleton<unsigned_int,_&snmalloc::CheckInitPthread::pthread_create>::get((bool *)0x0);
  pthread_setspecific(*puVar1,&register_clean_up::p_teardown_val);
  return;
}

Assistant:

static void register_clean_up()
    {
      Singleton<pthread_key_t, &pthread_create> p_key;
      // We need to set a non-null value, so that the destructor is called,
      // we never look at the value.
      static char p_teardown_val = 1;
      pthread_setspecific(p_key.get(), &p_teardown_val);
#    ifdef SNMALLOC_TRACING
      message<1024>("Using pthread clean up");
#    endif
    }